

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyDocSaveFile(TidyDocImpl *doc,ctmbstr filnam)

{
  StreamOut *out_00;
  StreamOut *out;
  uint nl;
  uint outenc;
  FILE *fout;
  int status;
  ctmbstr filnam_local;
  TidyDocImpl *doc_local;
  
  fout._4_4_ = -2;
  _nl = (FILE *)0x0;
  if (((doc->errors == 0) || ((int)(doc->config).value[0x61].v == 0)) ||
     ((int)(doc->config).value[0x1e].v != 0)) {
    _nl = fopen(filnam,"wb");
  }
  else {
    fout._4_4_ = tidyDocStatus(doc);
  }
  if (_nl != (FILE *)0x0) {
    out_00 = prvTidyFileOutput(doc,(FILE *)_nl,(int)(doc->config).value[0x3c].v,
                               (uint)(doc->config).value[0x39].v);
    fout._4_4_ = tidyDocSaveStream(doc,out_00);
    fclose(_nl);
    (*doc->allocator->vtbl->free)(doc->allocator,out_00);
    if ((doc->filetimes).actime != 0) {
      utime(filnam,(utimbuf *)&doc->filetimes);
      memset(&doc->filetimes,0,0x10);
    }
  }
  if (fout._4_4_ < 0) {
    prvTidyReportFileError(doc,filnam,0x23d);
  }
  return fout._4_4_;
}

Assistant:

int         tidyDocSaveFile( TidyDocImpl* doc, ctmbstr filnam )
{
    int status = -ENOENT;
    FILE* fout = NULL;

    /* Don't zap input file if no output */
    if ( doc->errors > 0 &&
         cfgBool(doc, TidyWriteBack) && !cfgBool(doc, TidyForceOutput) )
        status = tidyDocStatus( doc );
    else
        fout = fopen( filnam, "wb" );

    if ( fout )
    {
        uint outenc = cfg( doc, TidyOutCharEncoding );
        uint nl = cfg( doc, TidyNewline );
        StreamOut* out = TY_(FileOutput)( doc, fout, outenc, nl );

        status = tidyDocSaveStream( doc, out );

        fclose( fout );
        TidyDocFree( doc, out );

#if PRESERVE_FILE_TIMES
        if ( doc->filetimes.actime )
        {
            /* set file last accessed/modified times to original values */
            utime( filnam, &doc->filetimes );
            TidyClearMemory( &doc->filetimes, sizeof(doc->filetimes) );
        }
#endif /* PRESERVFILETIMES */
    }
    if ( status < 0 ) /* Error message! */
        TY_(ReportFileError)( doc, filnam, FILE_CANT_OPEN );
    return status;
}